

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QFontDatabase::WritingSystem,_QString>_>::Data
          (Data<QHashPrivate::Node<QFontDatabase::WritingSystem,_QString>_> *this,
          Data<QHashPrivate::Node<QFontDatabase::WritingSystem,_QString>_> *other,size_t reserved)

{
  long lVar1;
  bool bVar2;
  char16_t *pcVar3;
  WritingSystem *pWVar4;
  long in_RSI;
  Span<QHashPrivate::Node<QFontDatabase::WritingSystem,_QString>_> *in_RDI;
  long in_FS_OFFSET;
  R RVar5;
  size_t otherNSpans;
  Node<QFontDatabase::WritingSystem,_QString> *newNode;
  Node<QFontDatabase::WritingSystem,_QString> *n;
  size_t index;
  Span *span;
  size_t s;
  Bucket it;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffff70;
  Span<QHashPrivate::Node<QFontDatabase::WritingSystem,_QString>_> *this_00;
  WritingSystem *key;
  size_t in_stack_ffffffffffffffb0;
  ulong i;
  WritingSystem *local_40;
  unsigned_long local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicAtomicInteger<int>::QBasicAtomicInteger
            (in_stack_ffffffffffffff70,(int)((ulong)in_RDI >> 0x20));
  (((QString *)((long)in_RDI->offsets + 8))->d).d = *(Data **)(in_RSI + 8);
  *(char16_t **)((long)in_RDI->offsets + 0x10) = (char16_t *)0x0;
  *(qsizetype *)((long)in_RDI->offsets + 0x18) = *(qsizetype *)(in_RSI + 0x18);
  *(undefined8 *)((long)in_RDI->offsets + 0x20) = 0;
  qMax<unsigned_long>((unsigned_long *)((long)in_RDI->offsets + 8),&local_20);
  pcVar3 = (char16_t *)GrowthPolicy::bucketsForCapacity((size_t)in_RDI);
  *(char16_t **)((long)in_RDI->offsets + 0x10) = pcVar3;
  RVar5 = allocateSpans(in_stack_ffffffffffffffb0);
  *(Span **)((long)in_RDI->offsets + 0x20) = RVar5.spans;
  pWVar4 = (WritingSystem *)(*(ulong *)(in_RSI + 0x10) >> 7);
  this_00 = in_RDI;
  key = pWVar4;
  for (local_40 = (WritingSystem *)0x0; local_40 < pWVar4;
      local_40 = (WritingSystem *)((long)local_40 + 1)) {
    lVar1 = *(long *)(in_RSI + 0x20);
    for (i = 0; i < 0x80; i = i + 1) {
      bVar2 = Span<QHashPrivate::Node<QFontDatabase::WritingSystem,_QString>_>::hasNode
                        ((Span<QHashPrivate::Node<QFontDatabase::WritingSystem,_QString>_> *)
                         (lVar1 + (long)local_40 * 0x90),i);
      if (bVar2) {
        Span<QHashPrivate::Node<QFontDatabase::WritingSystem,_QString>_>::at(this_00,(size_t)in_RDI)
        ;
        local_18.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_18.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_18 = findBucket<QFontDatabase::WritingSystem>
                             ((Data<QHashPrivate::Node<QFontDatabase::WritingSystem,_QString>_> *)
                              RVar5.spans,key);
        Bucket::insert((Bucket *)0x5a1c57);
        Node<QFontDatabase::WritingSystem,_QString>::Node
                  ((Node<QFontDatabase::WritingSystem,_QString> *)this_00,
                   (Node<QFontDatabase::WritingSystem,_QString> *)in_RDI);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }